

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ALSADriver.cpp
# Opt level: O2

uint __thiscall ALSAMidiDriver::getSourceAddr(ALSAMidiDriver *this,snd_seq_event_t *seq_event)

{
  return (uint)(ushort)((short)(&seq_event->source)[(ulong)((seq_event->type & 0xfe) == 0x42) * 2]
                        << 8 | (ushort)(&seq_event->source)
                                       [(ulong)((seq_event->type & 0xfe) == 0x42) * 2] >> 8);
}

Assistant:

unsigned int ALSAMidiDriver::getSourceAddr(snd_seq_event_t *seq_event) {
	snd_seq_addr addr;
	if (seq_event->type == SND_SEQ_EVENT_PORT_SUBSCRIBED || seq_event->type == SND_SEQ_EVENT_PORT_UNSUBSCRIBED)
		addr = seq_event->data.connect.sender;
	else
		addr = seq_event->source;
	return (addr.client << 8) | addr.port;
}